

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# until-done.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppLVar1;
  void *pvVar2;
  uint uVar3;
  QueuePolicy *q_policy;
  time_t tVar4;
  undefined4 *b;
  Link *pLVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  size_t *psVar9;
  ulong uVar10;
  int gid__;
  long lVar11;
  int iVar12;
  int iVar13;
  communicator world;
  LoadBlock local_1918;
  SaveBlock local_18f8;
  DestroyBlock local_18d8;
  CreateBlock local_18b8;
  environment env;
  undefined1 local_1888 [32];
  _Rb_tree_node_base local_1868;
  size_t local_1848 [2];
  _Rb_tree_node_base local_1838;
  size_t local_1818;
  CollectivesList *local_1810;
  cothread_t pvStack_1808;
  bool local_1800;
  void *local_17f8;
  Link *local_17f0;
  _Any_data local_17e8;
  code *local_17d8;
  code *pcStack_17d0;
  _Any_data local_17c8;
  code *local_17b8;
  code *pcStack_17b0;
  _Any_data local_17a8;
  code *local_1798;
  code *pcStack_1790;
  communicator local_1788;
  int res;
  Master *pMStack_1768;
  IExchangeInfo *local_1760;
  _Rb_tree_node_base local_1750;
  size_t local_1730 [2];
  _Rb_tree_node_base local_1720;
  size_t local_1700;
  CollectivesList *local_16f8;
  cothread_t pvStack_16f0;
  bool local_16e8;
  FileStorage storage;
  Master master;
  
  local_1888._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(local_1888,&master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  iVar12 = world.size_;
  pppLVar1 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"./DIY.XXXXXX","");
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_0013b378;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&storage.filename_templates_,1,(value_type *)&master,(allocator_type *)local_1888);
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  storage.filenames_.m_.mLock = 0;
  storage.max_size_.x_ = 0;
  storage.max_size_.m_.mLock = 0;
  storage.count_.x_ = 0;
  storage.count_.m_.mLock = 0;
  storage.current_size_.x_ = 0;
  storage.current_size_.m_.mLock = 0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_1788.comm_.data = world.comm_.data;
  local_1788.rank_ = world.rank_;
  local_1788.size_ = world.size_;
  local_1788.owner_ = false;
  local_18b8.super__Function_base._M_functor._8_8_ = 0;
  local_18b8.super__Function_base._M_functor._M_unused._M_object = create_block;
  local_18b8._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_18b8.super__Function_base._M_manager =
       std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_18d8.super__Function_base._M_functor._8_8_ = 0;
  local_18d8.super__Function_base._M_functor._M_unused._M_object = destroy_block;
  local_18d8._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_18d8.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_18f8.super__Function_base._M_functor._8_8_ = 0;
  local_18f8.super__Function_base._M_functor._M_unused._M_object = save_block;
  local_18f8._M_invoker =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_18f8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  local_1918.super__Function_base._M_functor._8_8_ = 0;
  local_1918.super__Function_base._M_functor._M_unused._M_object = load_block;
  local_1918._M_invoker =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_1918.super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0013b518;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_1788,-1,2,&local_18b8,&local_18d8,
                      &storage.super_ExternalStorage,&local_18f8,&local_1918,q_policy);
  if (local_1918.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1918.super__Function_base._M_manager)
              ((_Any_data *)&local_1918,(_Any_data *)&local_1918,__destroy_functor);
  }
  if (local_18f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18f8.super__Function_base._M_manager)
              ((_Any_data *)&local_18f8,(_Any_data *)&local_18f8,__destroy_functor);
  }
  if (local_18d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18d8.super__Function_base._M_manager)
              ((_Any_data *)&local_18d8,(_Any_data *)&local_18d8,__destroy_functor);
  }
  if (local_18b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18b8.super__Function_base._M_manager)
              ((_Any_data *)&local_18b8,(_Any_data *)&local_18b8,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_1788);
  gid__ = 0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  if (0 < iVar12) {
    iVar12 = iVar12 * 4;
    iVar13 = 1;
    if (1 < iVar12) {
      iVar13 = iVar12;
    }
    iVar12 = world.size_;
    do {
      if (gid__ % iVar12 == world.rank_) {
        b = (undefined4 *)operator_new(4);
        *b = 0;
        pLVar5 = (Link *)operator_new(0x20);
        (pLVar5->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013b650
        ;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        diy::Master::add(&master,gid__,b,pLVar5);
      }
      gid__ = gid__ + 1;
    } while (iVar13 != gid__);
  }
  do {
    _res = flip_coin;
    local_1888._0_8_ = 0;
    local_1888._8_8_ = (Master *)0x0;
    local_1888._24_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1888._16_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&res,(Skip *)local_1888);
    if ((IExchangeInfo *)local_1888._16_8_ != (IExchangeInfo *)0x0) {
      (*(code *)local_1888._16_8_)((Proxy *)local_1888,(Proxy *)local_1888,3);
    }
    local_17e8._M_unused._M_object = (void *)0x0;
    local_17e8._8_8_ = 0;
    pcStack_17d0 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
    local_17d8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_17c8._M_unused._M_object = (void *)0x0;
    local_17c8._8_8_ = 0;
    pcStack_17b0 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
    local_17b8 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_17a8._M_unused._M_object = (void *)0x0;
    local_17a8._8_8_ = 0;
    pcStack_1790 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
    local_1798 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_17e8);
    if (local_1798 != (code *)0x0) {
      (*local_1798)(&local_17a8,&local_17a8,__destroy_functor);
    }
    if (local_17b8 != (code *)0x0) {
      (*local_17b8)(&local_17c8,&local_17c8,__destroy_functor);
    }
    if (local_17d8 != (code *)0x0) {
      (*local_17d8)(&local_17e8,&local_17e8,__destroy_functor);
    }
    uVar6 = (ulong)((long)master.blocks_.elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)master.blocks_.elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar3 = (uint)uVar6;
    if ((int)uVar3 < 1) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar10 = uVar8;
        if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != (void *)0x0) break;
        uVar8 = uVar8 + 1;
        uVar10 = uVar6;
      } while ((uVar3 & 0x7fffffff) != uVar8);
      lVar11 = (long)(int)uVar10;
    }
    diy::Master::Proxy::Proxy
              ((Proxy *)&res,&master,
               master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11],(IExchangeInfo *)0x0);
    pvVar2 = master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
    pLVar5 = master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
    local_1888._0_8_ = _res;
    local_1888._8_8_ = pMStack_1768;
    local_1888._16_8_ = local_1760;
    if (local_1750._M_parent == (_Base_ptr)0x0) {
      local_1868._M_color = _S_red;
      local_1868._M_parent = (_Base_ptr)0x0;
      psVar9 = local_1848;
      local_1868._M_left = &local_1868;
      local_1868._M_right = &local_1868;
    }
    else {
      local_1868._M_color = local_1750._M_color;
      local_1868._M_parent = local_1750._M_parent;
      local_1868._M_left = local_1750._M_left;
      local_1868._M_right = local_1750._M_right;
      (local_1750._M_parent)->_M_parent = &local_1868;
      local_1848[0] = local_1730[0];
      local_1750._M_parent = (_Base_ptr)0x0;
      psVar9 = local_1730;
      local_1750._M_left = &local_1750;
      local_1750._M_right = &local_1750;
    }
    *psVar9 = 0;
    if (local_1720._M_parent == (_Base_ptr)0x0) {
      local_1838._M_color = _S_red;
      local_1838._M_parent = (_Base_ptr)0x0;
      local_1838._M_left = &local_1838;
      psVar9 = &local_1818;
      local_1838._M_right = local_1838._M_left;
    }
    else {
      local_1838._M_color = local_1720._M_color;
      local_1838._M_parent = local_1720._M_parent;
      local_1838._M_left = local_1720._M_left;
      local_1838._M_right = local_1720._M_right;
      (local_1720._M_parent)->_M_parent = &local_1838;
      local_1818 = local_1700;
      local_1720._M_parent = (_Base_ptr)0x0;
      local_1720._M_left = &local_1720;
      psVar9 = &local_1700;
      local_1720._M_right = local_1720._M_left;
    }
    *psVar9 = 0;
    local_1800 = local_16e8;
    local_1810 = local_16f8;
    pvStack_1808 = pvStack_16f0;
    local_17f8 = pvVar2;
    local_17f0 = pLVar5;
    diy::Master::Proxy::~Proxy((Proxy *)&res);
    plVar7 = (long *)(local_1810->
                     super_list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>).
                     super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>
                     ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    (**(code **)(*plVar7 + 0x20))(plVar7,(Proxy *)&res);
    iVar12 = res;
    diy::Master::Proxy::~Proxy((Proxy *)local_1888);
  } while (iVar12 == 0);
  if (world.rank_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Total iterations: ",0x12);
    uVar6 = (ulong)((long)master.blocks_.elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)master.blocks_.elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar3 = (uint)uVar6;
    if ((int)uVar3 < 1) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar10 = uVar8;
        if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != (void *)0x0) break;
        uVar8 = uVar8 + 1;
        uVar10 = uVar6;
      } while ((uVar3 & 0x7fffffff) != uVar8);
      lVar11 = (long)(int)uVar10 << 3;
    }
    plVar7 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cout,
                                **(int **)((long)master.blocks_.elements_.
                                                 super__Vector_base<void_*,_std::allocator<void_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar11)
                               );
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       nblocks = 4*world.size();

  diy::FileStorage          storage("./DIY.XXXXXX");

  diy::Master               master(world,
                                   -1,
                                   2,
                                   &create_block,
                                   &destroy_block,
                                   &storage,
                                   &save_block,
                                   &load_block);

  srand(static_cast<unsigned int>(time(NULL)));

  //diy::ContiguousAssigner   assigner(world.size(), nblocks);
  diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  for (int gid = 0; gid < nblocks; ++gid)
    if (assigner.rank(gid) == world.rank())
      master.add(gid, new Block, new diy::Link);

  bool all_done = false;
  while (!all_done)
  {
    master.foreach(&flip_coin);
    master.exchange();
    all_done = master.proxy(master.loaded_block()).read<int>();
  }

  if (world.rank() == 0)
    std::cout << "Total iterations: " << master.block<Block>(master.loaded_block())->count << std::endl;
}